

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O3

void brotli::SplitByteVector<brotli::Histogram<520>,unsigned_short>
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *data,
               size_t literals_per_histogram,size_t max_histograms,size_t sampling_stride_length,
               double block_switch_cost,BlockSplit *split)

{
  unsigned_short *puVar1;
  unsigned_short *puVar2;
  iterator __position;
  uint uVar3;
  size_t length;
  long lVar4;
  vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> histograms;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_ids;
  allocator_type local_59;
  vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  double local_28;
  
  puVar1 = (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 == puVar2) {
    split->num_types = 1;
  }
  else {
    length = (long)puVar2 - (long)puVar1 >> 1;
    local_28 = block_switch_cost;
    if (length < 0x80) {
      split->num_types = 1;
      local_58.super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)local_58.
                            super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&split->types,(uchar *)&local_58);
      uVar3 = (uint)((ulong)((long)(data->
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(data->
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 1);
      local_58.super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_58.
                             super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar3);
      __position._M_current =
           (split->lengths).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (split->lengths).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&split->lengths,__position,(uint *)&local_58);
      }
      else {
        *__position._M_current = uVar3;
        (split->lengths).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
    else {
      local_58.super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      InitialEntropyCodes<brotli::Histogram<520>,unsigned_short>
                (puVar1,length,literals_per_histogram,max_histograms,sampling_stride_length,
                 &local_58);
      puVar1 = (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               super__Vector_impl_data._M_start;
      RefineEntropyCodes<brotli::Histogram<520>,unsigned_short>
                (puVar1,(long)(data->
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 1,
                 sampling_stride_length,&local_58);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_40,
                 (long)(data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 1,&local_59);
      lVar4 = 10;
      do {
        puVar1 = (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        FindBlocks<unsigned_short,520>
                  (puVar1,(long)(data->
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)
                                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 1,
                   local_28,&local_58,
                   local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        puVar1 = (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        BuildBlockHistograms<brotli::Histogram<520>,unsigned_short>
                  (puVar1,(long)(data->
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)
                                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 1,
                   local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,&local_58);
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      puVar1 = (data->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               super__Vector_impl_data._M_start;
      ClusterBlocks<brotli::Histogram<520>,unsigned_short>
                (puVar1,(long)(data->
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 1,
                 local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      BuildBlockSplit(&local_40,split);
      if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uint8_t *)0x0) {
        operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_40.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_40.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_58.
          super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.
                        super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void SplitByteVector(const std::vector<DataType>& data,
                     const size_t literals_per_histogram,
                     const size_t max_histograms,
                     const size_t sampling_stride_length,
                     const double block_switch_cost,
                     BlockSplit* split) {
  if (data.empty()) {
    split->num_types = 1;
    return;
  } else if (data.size() < kMinLengthForBlockSplitting) {
    split->num_types = 1;
    split->types.push_back(0);
    split->lengths.push_back(static_cast<uint32_t>(data.size()));
    return;
  }
  std::vector<HistogramType> histograms;
  // Find good entropy codes.
  InitialEntropyCodes(&data[0], data.size(),
                      literals_per_histogram,
                      max_histograms,
                      sampling_stride_length,
                      &histograms);
  RefineEntropyCodes(&data[0], data.size(),
                     sampling_stride_length,
                     &histograms);
  // Find a good path through literals with the good entropy codes.
  std::vector<uint8_t> block_ids(data.size());
  for (size_t i = 0; i < 10; ++i) {
    FindBlocks(&data[0], data.size(),
               block_switch_cost,
               histograms,
               &block_ids[0]);
    BuildBlockHistograms(&data[0], data.size(), &block_ids[0], &histograms);
  }
  ClusterBlocks<HistogramType>(&data[0], data.size(), &block_ids[0]);
  BuildBlockSplit(block_ids, split);
}